

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

void __thiscall DROPlayer::DoCommand_v2(DROPlayer *this)

{
  byte bVar1;
  byte data;
  uint uVar2;
  UINT32 UVar3;
  
  uVar2 = this->_filePos;
  UVar3 = DataLoader_GetSize(this->_dLoad);
  if (UVar3 <= uVar2) {
    DoFileEnd(this);
    return;
  }
  uVar2 = this->_filePos;
  bVar1 = this->_fileData[uVar2];
  data = this->_fileData[uVar2 + 1];
  this->_filePos = uVar2 + 2;
  if (bVar1 == (this->_fileHdr).cmdDlyShort) {
    UVar3 = this->_fileTick + (uint)data + 1;
  }
  else {
    if (bVar1 != (this->_fileHdr).cmdDlyLong) {
      if ((this->_fileHdr).regCmdCnt <= (byte)(bVar1 & 0x7f)) {
        return;
      }
      WriteReg(this,bVar1 >> 7,(this->_fileHdr).regCmdMap[bVar1 & 0x7f],data);
      return;
    }
    UVar3 = this->_fileTick + (uint)data * 0x100 + 0x100;
  }
  this->_fileTick = UVar3;
  return;
}

Assistant:

void DROPlayer::DoCommand_v2(void)
{
	if (_filePos >= DataLoader_GetSize(_dLoad))
	{
		DoFileEnd();
		return;
	}
	
	UINT8 port;
	UINT8 reg;
	UINT8 data;
	
	//emu_logf(&_logger, PLRLOG_TRACE, "[DRO v2] Ofs %04X, Command %02X data %02X\n", _filePos, _fileData[_filePos], _fileData[_filePos+1]);
	reg = _fileData[_filePos + 0x00];
	data = _fileData[_filePos + 0x01];
	_filePos += 0x02;
	if (reg == _fileHdr.cmdDlyShort)
	{
		_fileTick += (1 + data);
		return;
	}
	else if (reg == _fileHdr.cmdDlyLong)
	{
		_fileTick += (1 + data) << 8;
		return;
	}
	port = (reg & 0x80) >> 7;
	reg &= 0x7F;
	if (reg >= _fileHdr.regCmdCnt)
		return;	// invalid register
	
	reg = _fileHdr.regCmdMap[reg];
	WriteReg(port, reg, data);
	
	return;
}